

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  TriggerPrg **ppTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  sqlite3 *db;
  sqlite3 *db_00;
  Vdbe *p;
  TriggerStep *pStep;
  VdbeOp *pVVar4;
  u8 uVar5;
  int iVar6;
  TriggerPrg *pTVar7;
  SubProgram *pSVar8;
  Parse *pParse_00;
  Vdbe *pVVar9;
  char *zP4;
  Expr *pEVar10;
  SrcList *pSVar11;
  ExprList *pEVar12;
  IdList *pColumn;
  Select *pSVar13;
  TriggerPrg **ppTVar14;
  Parse *pPVar15;
  TriggerStep **ppTVar16;
  uint local_cc;
  SelectDest local_78;
  NameContext local_68;
  
  pPVar15 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar15 = pParse;
  }
  ppTVar1 = &pPVar15->pTriggerPrg;
  ppTVar14 = ppTVar1;
  while( true ) {
    pTVar7 = *ppTVar14;
    if (pTVar7 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar7 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
      if (pTVar7 != (TriggerPrg *)0x0) {
        pTVar7->pNext = *ppTVar1;
        *ppTVar1 = pTVar7;
        pSVar8 = (SubProgram *)sqlite3DbMallocZero(db,0x28);
        pTVar7->pProgram = pSVar8;
        if (pSVar8 != (SubProgram *)0x0) {
          pVVar9 = pPVar15->pVdbe;
          pSVar8->pNext = pVVar9->pProgram;
          pVVar9->pProgram = pSVar8;
          pTVar7->pTrigger = pTrigger;
          pTVar7->orconf = orconf;
          pTVar7->aColmask[0] = 0xffffffff;
          pTVar7->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocZero(db,0x298);
          if (pParse_00 != (Parse *)0x0) {
            local_68.nRef = 0;
            local_68.nErr = 0;
            local_68.ncFlags = '\0';
            local_68._49_7_ = 0;
            local_68.pAggInfo = (AggInfo *)0x0;
            local_68.pNext = (NameContext *)0x0;
            local_68.pSrcList = (SrcList *)0x0;
            local_68.pEList = (ExprList *)0x0;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar15;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            local_68.pParse = pParse_00;
            pVVar9 = sqlite3GetVdbe(pParse_00);
            if (pVVar9 != (Vdbe *)0x0) {
              local_cc = 0;
              zP4 = sqlite3MPrintf(db,"-- TRIGGER %s",pTrigger->zName);
              sqlite3VdbeChangeP4(pVVar9,-1,zP4,-1);
              if (pTrigger->pWhen != (Expr *)0x0) {
                local_cc = 0;
                pEVar10 = sqlite3ExprDup(db,pTrigger->pWhen,0);
                iVar6 = sqlite3ResolveExprNames(&local_68,pEVar10);
                if ((iVar6 == 0) && (db->mallocFailed == '\0')) {
                  local_cc = sqlite3VdbeMakeLabel(pVVar9);
                  sqlite3ExprIfFalse(pParse_00,pEVar10,local_cc,8);
                }
                sqlite3ExprDelete(db,pEVar10);
              }
              db_00 = pParse_00->db;
              p = pParse_00->pVdbe;
              ppTVar16 = &pTrigger->step_list;
              while (pStep = *ppTVar16, pStep != (TriggerStep *)0x0) {
                uVar5 = (u8)orconf;
                if (orconf == 99) {
                  uVar5 = pStep->orconf;
                }
                pParse_00->eOrconf = uVar5;
                pParse_00->cookieGoto = 0;
                uVar5 = pStep->op;
                if (uVar5 == 'i') {
                  pSVar11 = targetSrcList(pParse_00,pStep);
                  pEVar12 = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                  pSVar13 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                  pColumn = sqlite3IdListDup(db_00,pStep->pIdList);
                  sqlite3Insert(pParse_00,pSVar11,pEVar12,pSVar13,pColumn,(uint)pParse_00->eOrconf);
                }
                else if (uVar5 == 'j') {
                  pSVar11 = targetSrcList(pParse_00,pStep);
                  pEVar10 = sqlite3ExprDup(db_00,pStep->pWhere,0);
                  sqlite3DeleteFrom(pParse_00,pSVar11,pEVar10);
                }
                else if (uVar5 == 'k') {
                  pSVar11 = targetSrcList(pParse_00,pStep);
                  pEVar12 = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                  pEVar10 = sqlite3ExprDup(db_00,pStep->pWhere,0);
                  sqlite3Update(pParse_00,pSVar11,pEVar12,pEVar10,(uint)pParse_00->eOrconf);
                }
                else {
                  pSVar13 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                  local_78.eDest = '\x04';
                  local_78.affSdst = '\0';
                  local_78.iSDParm = 0;
                  local_78.iSdst = 0;
                  local_78.nSdst = 0;
                  sqlite3Select(pParse_00,pSVar13,&local_78);
                  sqlite3SelectDelete(db_00,pSVar13);
                }
                if (pStep->op != 't') {
                  sqlite3VdbeAddOp0(p,0x3c);
                }
                ppTVar16 = &pStep->pNext;
              }
              if ((local_cc != 0) && (pVVar9->aLabel != (int *)0x0)) {
                pVVar9->aLabel[(int)~local_cc] = pVVar9->nOp;
              }
              sqlite3VdbeAddOp0(pVVar9,6);
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pParse_00->zErrMsg;
                pParse->nErr = pParse_00->nErr;
              }
              else {
                sqlite3DbFree(pParse_00->db,pParse_00->zErrMsg);
              }
              if (db->mallocFailed == '\0') {
                pVVar4 = pVVar9->aOp;
                resolveP2Values(pVVar9,&pPVar15->nMaxArg);
                pSVar8->nOp = pVVar9->nOp;
                pVVar9->aOp = (Op *)0x0;
                pSVar8->aOp = pVVar4;
              }
              uVar2 = pParse_00->nTab;
              uVar3 = pParse_00->nMem;
              pSVar8->nMem = uVar3;
              pSVar8->nCsr = uVar2;
              pSVar8->nOnce = pParse_00->nOnce;
              pSVar8->token = pTrigger;
              pTVar7->aColmask[0] = pParse_00->oldmask;
              pTVar7->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar9);
            }
            sqlite3DbFree(db,pParse_00);
            return pTVar7;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar7->pTrigger == pTrigger) && (pTVar7->orconf == orconf)) break;
    ppTVar14 = &pTVar7->pNext;
  }
  return pTVar7;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}